

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int re_parse_alternative(REParseState *s,BOOL is_backward_dir)

{
  size_t sVar1;
  bool bVar2;
  anon_union_128_2_3affbfe2_for_u *data;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  BOOL BVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  sbyte sVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  int count;
  anon_union_128_2_3affbfe2_for_u *paVar17;
  uint8_t uVar18;
  uint uVar19;
  undefined4 in_register_00000034;
  uint8_t *puVar20;
  char *pcVar21;
  byte *pbVar22;
  byte *pbVar23;
  int iVar24;
  byte *local_208;
  anon_union_128_2_3affbfe2_for_u *local_200;
  ulong local_1f8;
  uint local_1ec;
  undefined8 local_1e8;
  ulong local_1e0;
  uint local_1d4;
  ulong local_1d0;
  byte *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  CharRange cr_s_1;
  undefined8 local_180;
  CharRange cr1_s;
  CharRange a;
  CharRange cr_s;
  
  local_1e8 = CONCAT44(in_register_00000034,is_backward_dir);
  sVar1 = (s->byte_code).size;
  paVar17 = &s->u;
  local_1bc = is_backward_dir + 0x13;
  local_1b4 = is_backward_dir + 0xb;
  local_1b8 = 0xc - is_backward_dir;
  local_200 = paVar17;
  do {
    data = local_200;
    pbVar23 = s->buf_ptr;
    if (((s->buf_end <= pbVar23) || (bVar3 = *pbVar23, bVar3 == 0x29)) || (bVar3 == 0x7c)) {
      return 0;
    }
    uVar11 = (s->byte_code).size;
    local_208 = pbVar23;
    local_1d0 = uVar11;
    switch(bVar3) {
    case 0x5b:
      local_1f8 = (ulong)(uint)s->capture_count;
      if ((int)local_1e8 != 0) {
        dbuf_putc(&s->byte_code,'\x1b');
      }
      cr_init(&cr_s_1,s->opaque,lre_realloc);
      pbVar22 = pbVar23 + 1;
      bVar3 = pbVar23[1];
      if (bVar3 == 0x5e) {
        pbVar22 = pbVar23 + 2;
      }
      local_1c8 = pbVar22;
      while (*pbVar22 != 0x5d) {
        uVar6 = get_class_atom(s,&cr1_s,&local_1c8,1);
        pbVar22 = local_1c8;
        if ((int)uVar6 < 0) goto LAB_001601b1;
        if ((*local_1c8 == 0x2d) && (local_1c8[1] != 0x5d)) {
          a._0_8_ = local_1c8 + 1;
          if (uVar6 < 0x40000000) {
            uVar7 = get_class_atom(s,&cr1_s,(uint8_t **)&a,1);
            if ((int)uVar7 < 0) goto LAB_001601b1;
            if (uVar7 < 0x40000000) {
              local_1c8 = (byte *)a._0_8_;
              pbVar22 = (byte *)a._0_8_;
              if (uVar6 <= uVar7) goto LAB_0015f2ee;
            }
            else {
              cr_free(&cr1_s);
              if (s->is_utf16 == 0) goto LAB_0015f2ad;
            }
          }
          else {
            if (s->is_utf16 == 0) goto LAB_0015f2ad;
            cr_free(&cr1_s);
          }
          re_parse_error(s,"invalid class range");
          goto LAB_001601b1;
        }
LAB_0015f2ad:
        uVar7 = uVar6;
        if (uVar6 < 0x40000000) {
LAB_0015f2ee:
          iVar5 = cr_union_interval(&cr_s_1,uVar6,uVar7);
        }
        else {
          iVar5 = cr_union1(&cr_s_1,cr1_s.points,cr1_s.len);
          cr_free(&cr1_s);
        }
        if (iVar5 != 0) goto LAB_001601a9;
      }
      if (s->ignore_case == 0) {
LAB_0015f809:
        if ((bVar3 != 0x5e) || (iVar5 = cr_invert(&cr_s_1), iVar5 == 0)) {
          iVar5 = re_emit_range(s,&cr_s_1);
          if (iVar5 != 0) goto LAB_001601b1;
          cr_free(&cr_s_1);
          local_208 = pbVar22 + 1;
          uVar15 = local_1d0;
          paVar17 = local_200;
          if ((int)local_1e8 != 0) {
            dbuf_putc(&s->byte_code,'\x1b');
            uVar15 = local_1d0;
            paVar17 = local_200;
          }
          goto LAB_0015f93b;
        }
      }
      else {
        cr_init(&a,cr_s_1.mem_opaque,lre_realloc);
        local_180 = 0x7b00000061;
        iVar5 = cr_op(&a,cr_s_1.points,cr_s_1.len,(uint32_t *)&local_180,2,1);
        if (iVar5 == 0) {
          for (lVar10 = 0; lVar10 < a.len; lVar10 = lVar10 + 1) {
            a.points[lVar10] = a.points[lVar10] - 0x20;
          }
          iVar5 = cr_union1(&cr_s_1,a.points,a.len);
          cr_free(&a);
          if (iVar5 == 0) goto LAB_0015f809;
        }
        else {
          cr_free(&a);
        }
      }
LAB_001601a9:
      re_parse_out_of_memory(s);
LAB_001601b1:
      cr_free(&cr_s_1);
      return -1;
    case 0x5c:
      bVar3 = pbVar23[1];
      if (8 < bVar3 - 0x31) {
        if (bVar3 == 0x30) {
          local_208 = pbVar23 + 2;
          bVar3 = pbVar23[2];
          if (s->is_utf16 == 0) {
            if ((bVar3 & 0xf8) == 0x30) {
              uVar4 = bVar3 - 0x30;
              bVar3 = pbVar23[3];
              local_208 = pbVar23 + 3;
              if ((bVar3 & 0xf8) == 0x30) {
                local_208 = pbVar23 + 4;
LAB_0015f759:
                uVar4 = ((uint)bVar3 + uVar4 * 8) - 0x30;
              }
              goto LAB_0015f363;
            }
          }
          else if (0xfffffff5 < bVar3 - 0x3a) {
            pcVar21 = "invalid decimal escape in regular expression";
            goto LAB_00160155;
          }
          uVar4 = 0;
          goto LAB_0015f363;
        }
        if (bVar3 != 0x42) {
          if (bVar3 == 0x6b) {
            if (pbVar23[2] == 0x3c) {
              a._0_8_ = pbVar23 + 3;
              iVar5 = re_parse_group_name(paVar17->error_msg,(int)&a,
                                          (uint8_t **)(ulong)(uint)s->is_utf16,0x6b);
              if (iVar5 == 0) {
                uVar4 = find_group_name(s,paVar17->error_msg);
                if ((-1 < (int)uVar4) ||
                   (uVar4 = re_parse_captures(s,&cr_s_1.len,paVar17->error_msg), -1 < (int)uVar4)) {
                  local_208 = (byte *)a._0_8_;
                  goto LAB_0015f539;
                }
                if ((s->is_utf16 != 0) ||
                   (BVar9 = re_has_named_captures(s), paVar17 = local_200, BVar9 != 0)) {
                  pcVar21 = "group name not defined";
                  goto LAB_00160155;
                }
              }
              else if ((s->is_utf16 != 0) || (BVar9 = re_has_named_captures(s), BVar9 != 0)) {
LAB_001601dc:
                pcVar21 = "invalid group name";
                goto LAB_00160155;
              }
            }
            else if ((s->is_utf16 != 0) || (BVar9 = re_has_named_captures(s), BVar9 != 0)) {
              pcVar21 = "expecting group name";
              goto LAB_00160155;
            }
          }
          else if (bVar3 == 0x62) goto LAB_0015f6c2;
          goto switchD_0015f1a6_caseD_25;
        }
LAB_0015f6c2:
        dbuf_putc(&s->byte_code,(bVar3 != 0x62) + '\x11');
        pbVar23 = pbVar23 + 2;
        pbVar22 = pbVar23;
        goto LAB_0015ff39;
      }
      pbVar22 = pbVar23 + 1;
      local_208 = pbVar22;
      uVar4 = parse_digits(&local_208,0);
      if ((-1 < (int)uVar4) &&
         (((int)uVar4 < s->capture_count || (iVar5 = re_count_captures(s), (int)uVar4 < iVar5)))) {
LAB_0015f539:
        sVar12 = (s->byte_code).size;
        local_1f8 = (ulong)(uint)s->capture_count;
        re_emit_op_u8(s,local_1bc,uVar4);
        uVar15 = (ulong)(uint)sVar12;
        paVar17 = local_200;
        goto LAB_0015f93b;
      }
      if (s->is_utf16 != 0) {
        pcVar21 = "back reference out of range in regular expression";
        goto LAB_00160155;
      }
      bVar3 = *pbVar22;
      uVar4 = (uint32_t)bVar3;
      paVar17 = local_200;
      if (bVar3 < 0x38) {
        uVar4 = 0;
        if (bVar3 < 0x34) {
          pbVar22 = pbVar23 + 2;
          uVar4 = bVar3 - 0x30;
          bVar3 = pbVar23[2];
        }
        local_208 = pbVar22;
        if ((bVar3 & 0xf8) == 0x30) {
          uVar4 = ((uint)bVar3 + uVar4 * 8) - 0x30;
          bVar3 = pbVar22[1];
          local_208 = pbVar22 + 1;
          if ((bVar3 & 0xf8) == 0x30) {
            local_208 = pbVar22 + 2;
            goto LAB_0015f759;
          }
        }
      }
      else {
        local_208 = pbVar23 + 2;
      }
      goto LAB_0015f363;
    case 0x5d:
switchD_0015f1c1_caseD_5d:
      if (s->is_utf16 != 0) {
LAB_0016014e:
        pcVar21 = "syntax error";
        goto LAB_00160155;
      }
      goto switchD_0015f1a6_caseD_25;
    case 0x5e:
      uVar18 = '\x05';
LAB_0015f565:
      pbVar23 = pbVar23 + 1;
      local_208 = pbVar23;
      dbuf_putc(&s->byte_code,uVar18);
      pbVar22 = local_208;
      goto LAB_0015ff39;
    }
    switch(bVar3) {
    case 0x24:
      uVar18 = '\x06';
      goto LAB_0015f565;
    case 0x28:
      if (pbVar23[1] == 0x3f) {
        bVar3 = pbVar23[2];
        local_1f8 = 0;
        lVar10 = 3;
        if (bVar3 == 0x21) {
          bVar2 = false;
          BVar9 = 0;
        }
        else {
          bVar2 = false;
          BVar9 = 0;
          if (bVar3 != 0x3d) {
            if (bVar3 != 0x3c) {
              if (bVar3 != 0x3a) {
                pcVar21 = "invalid group";
                goto LAB_00160155;
              }
              local_1f8 = (ulong)(uint)s->capture_count;
              s->buf_ptr = pbVar23 + 3;
              iVar5 = re_parse_disjunction(s,(int)local_1e8);
              paVar17 = local_200;
              if (iVar5 != 0) {
                return -1;
              }
              local_208 = s->buf_ptr;
              iVar5 = re_parse_expect(s,&local_208,0x29);
              uVar15 = local_1d0;
              goto LAB_0015f67a;
            }
            bVar3 = pbVar23[3];
            bVar2 = true;
            lVar10 = 4;
            BVar9 = 1;
            if ((bVar3 != 0x3d) && (bVar3 != 0x21)) {
              local_208 = pbVar23 + 3;
              iVar5 = re_parse_group_name(local_200->error_msg,(int)&local_208,
                                          (uint8_t **)(ulong)(uint)s->is_utf16,4);
              if (iVar5 != 0) goto LAB_001601dc;
              iVar5 = find_group_name(s,data->error_msg);
              if (0 < iVar5) {
                pcVar21 = "duplicate group name";
                goto LAB_00160155;
              }
              sVar16 = strlen(data->error_msg);
              dbuf_put(&s->group_names,(uint8_t *)data->error_msg,sVar16 + 1);
              s->has_named_captures = 1;
              paVar17 = data;
              goto LAB_0015f60a;
            }
          }
        }
        if (bVar2) {
          uVar15 = 0xffffffff;
        }
        else {
          uVar15 = 0xffffffff;
          if (s->is_utf16 == 0) {
            local_1f8 = (ulong)(uint)s->capture_count;
            uVar15 = uVar11 & 0xffffffff;
          }
        }
        iVar5 = re_emit_op_u32(s,(bVar3 == 0x21) + 0x17,0);
        s->buf_ptr = pbVar23 + lVar10;
        iVar8 = re_parse_disjunction(s,BVar9);
        paVar17 = local_200;
        if (iVar8 != 0) {
          return -1;
        }
        local_208 = s->buf_ptr;
        iVar8 = re_parse_expect(s,&local_208,0x29);
        if (iVar8 != 0) {
          return -1;
        }
        dbuf_putc(&s->byte_code,'\n');
        if ((s->byte_code).error != 0) {
          return -1;
        }
        *(int *)((s->byte_code).buf + iVar5) = ((int)(s->byte_code).size - iVar5) + -4;
      }
      else {
        local_208 = pbVar23 + 1;
        dbuf_putc(&s->group_names,'\0');
LAB_0015f60a:
        uVar6 = s->capture_count;
        if (0xfe < (int)uVar6) {
          pcVar21 = "too many captures";
          goto LAB_00160155;
        }
        uVar15 = (s->byte_code).size;
        s->capture_count = uVar6 + 1;
        local_1f8 = (ulong)uVar6;
        re_emit_op_u8(s,local_1b4,uVar6);
        s->buf_ptr = local_208;
        iVar5 = re_parse_disjunction(s,(BOOL)local_1e8);
        if (iVar5 != 0) {
          return -1;
        }
        local_208 = s->buf_ptr;
        re_emit_op_u8(s,local_1b8,(uint32_t)local_1f8);
        iVar5 = re_parse_expect(s,&local_208,0x29);
LAB_0015f67a:
        if (iVar5 != 0) {
          return -1;
        }
      }
      break;
    case 0x2a:
    case 0x2b:
switchD_0015f1a6_caseD_2a:
      pcVar21 = "nothing to repeat";
      goto LAB_00160155;
    case 0x2e:
      local_208 = pbVar23 + 1;
      local_1f8 = (ulong)(uint)s->capture_count;
      if ((int)local_1e8 == 0) {
        uVar18 = '\x04' - (s->dotall == 0);
      }
      else {
        dbuf_putc(&s->byte_code,'\x1b');
        dbuf_putc(&s->byte_code,'\x04' - (s->dotall == 0));
        uVar18 = '\x1b';
      }
      dbuf_putc(&s->byte_code,uVar18);
      uVar15 = uVar11 & 0xffffffff;
      break;
    default:
      if (bVar3 == 0x7b) {
        if (s->is_utf16 != 0) goto LAB_0016014e;
        if (0xfffffff5 < pbVar23[1] - 0x3a) {
          a._0_8_ = pbVar23 + 1;
          parse_digits((uint8_t **)&a,1);
          bVar3 = *(byte *)a._0_8_;
          if (bVar3 == 0x2c) {
            lVar10 = a._0_8_ + 1;
            bVar3 = *(byte *)(a._0_8_ + 1);
            a._0_8_ = lVar10;
            if (0xfffffff5 < bVar3 - 0x3a) {
              parse_digits((uint8_t **)&a,1);
              bVar3 = *(byte *)a._0_8_;
            }
          }
          if (bVar3 == 0x7d) goto switchD_0015f1a6_caseD_2a;
        }
      }
      else {
        if (bVar3 == 0x7d) goto switchD_0015f1c1_caseD_5d;
        if (bVar3 == 0x3f) goto switchD_0015f1a6_caseD_2a;
      }
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2d:
switchD_0015f1a6_caseD_25:
      uVar4 = get_class_atom(s,&cr_s,&local_208,0);
      if ((int)uVar4 < 0) {
        return -1;
      }
LAB_0015f363:
      uVar15 = (ulong)(uint)(s->byte_code).size;
      local_1f8 = (ulong)(uint)s->capture_count;
      if ((int)local_1e8 != 0) {
        dbuf_putc(&s->byte_code,'\x1b');
      }
      if ((int)uVar4 < 0x40000000) {
        if (s->ignore_case != 0) {
          uVar4 = lre_canonicalize(uVar4,s->is_utf16);
        }
        if ((int)uVar4 < 0x10000) {
          re_emit_op_u16(s,1,uVar4);
        }
        else {
          re_emit_op_u32(s,2,uVar4);
        }
      }
      else {
        iVar5 = re_emit_range(s,&cr_s);
        cr_free(&cr_s);
        paVar17 = local_200;
        if (iVar5 != 0) {
          return -1;
        }
      }
      if ((int)local_1e8 != 0) {
        dbuf_putc(&s->byte_code,'\x1b');
      }
    }
LAB_0015f93b:
    pbVar23 = local_208;
    uVar4 = (uint32_t)uVar15;
    pbVar22 = pbVar23;
    if (-1 < (int)uVar4) {
      bVar3 = *local_208;
      if (bVar3 == 0x7b) {
        if (local_208[1] - 0x3a < 0xfffffff6) {
          if (s->is_utf16 != 0) {
LAB_0016018a:
            pcVar21 = "invalid repetition count";
LAB_00160155:
            re_parse_error(s,pcVar21);
            return -1;
          }
        }
        else {
          local_208 = local_208 + 1;
          uVar6 = parse_digits(&local_208,1);
          bVar3 = *local_208;
          uVar7 = uVar6;
          if (bVar3 == 0x2c) {
            bVar3 = local_208[1];
            if (bVar3 - 0x3a < 0xfffffff6) {
              uVar7 = 0x7fffffff;
              local_208 = local_208 + 1;
            }
            else {
              local_208 = local_208 + 1;
              uVar7 = parse_digits(&local_208,1);
              if ((int)uVar7 < (int)uVar6) goto LAB_0016018a;
              bVar3 = *local_208;
            }
          }
          if ((bVar3 == 0x7d) || (s->is_utf16 != 0)) {
            iVar5 = re_parse_expect(s,&local_208,0x7d);
            pbVar23 = local_208;
            if (iVar5 != 0) {
              return -1;
            }
            goto LAB_0015fa46;
          }
        }
      }
      else {
        if (bVar3 == 0x2b) {
          local_208 = local_208 + 1;
          uVar7 = 0x7fffffff;
          uVar6 = 1;
          pbVar23 = local_208;
        }
        else if (bVar3 == 0x3f) {
          local_208 = local_208 + 1;
          uVar6 = 0;
          uVar7 = 1;
          pbVar23 = local_208;
        }
        else {
          if (bVar3 != 0x2a) goto LAB_0015ff39;
          uVar6 = 0;
          uVar7 = 0x7fffffff;
          pbVar23 = local_208 + 1;
        }
LAB_0015fa46:
        uVar11 = uVar15 & 0xffffffff;
        local_1e0 = uVar11;
        if (*pbVar23 == 0x3f) {
          pbVar23 = pbVar23 + 1;
          iVar24 = (int)(s->byte_code).size - uVar4;
          uVar19 = 0;
          uVar11 = 0;
          local_208 = pbVar23;
        }
        else {
          iVar5 = (s->byte_code).error;
          local_1ec = uVar7;
          local_1d4 = uVar6;
          if (0 < (int)uVar7) {
            if (iVar5 != 0) goto LAB_0016013b;
            puVar20 = (s->byte_code).buf;
            iVar24 = 0;
            iVar8 = 0;
            while (iVar24 < (int)((int)(s->byte_code).size - uVar4)) {
              bVar3 = puVar20[(long)iVar24 + uVar11];
              if (0x15 < bVar3 - 1) goto switchD_0015fad0_caseD_7;
              uVar6 = (uint)reopcode_info[bVar3].size;
              sVar13 = 2;
              switch((uint)bVar3) {
              default:
                goto switchD_0015fad0_caseD_7;
              case 0x16:
                sVar13 = 3;
              case 0x15:
                uVar6 = (uint)reopcode_info[bVar3].size +
                        ((uint)*(ushort *)(puVar20 + (long)iVar24 + uVar11 + 1) << sVar13);
              case 1:
              case 2:
              case 3:
              case 4:
                iVar8 = iVar8 + 1;
              case 5:
              case 6:
              case 0x11:
              case 0x12:
                iVar24 = iVar24 + uVar6;
              }
            }
            if (0 < iVar8) {
              dbuf_putc(&s->byte_code,'\n');
              iVar5 = dbuf_insert(&s->byte_code,uVar4,0x11);
              if (iVar5 != 0) goto LAB_0016013b;
              (s->byte_code).buf[local_1e0] = '\x1c';
              puVar20 = (s->byte_code).buf;
              *(uint32_t *)(puVar20 + local_1e0 + 1) = ((int)(s->byte_code).size - uVar4) + -0x11;
              *(uint *)(puVar20 + local_1e0 + 5) = local_1d4;
              *(uint *)(puVar20 + local_1e0 + 9) = local_1ec;
              *(int *)(puVar20 + local_1e0 + 0xd) = iVar8;
              paVar17 = local_200;
              pbVar22 = local_208;
              goto LAB_0015ff39;
            }
          }
switchD_0015fad0_caseD_7:
          if (iVar5 != 0) goto LAB_0016013b;
          puVar20 = (s->byte_code).buf;
          iVar24 = (int)(s->byte_code).size - uVar4;
          memset(&a,0,0xff);
          iVar5 = -2;
          bVar2 = false;
          for (iVar8 = 0; iVar8 < iVar24; iVar8 = iVar8 + uVar6) {
            uVar6 = (uint)reopcode_info[puVar20[(long)iVar8 + uVar11]].size;
            sVar13 = 2;
            switch(puVar20[(long)iVar8 + uVar11]) {
            case '\x05':
            case '\x06':
            case '\x0f':
            case '\x10':
            case '\x11':
            case '\x12':
            case '\x19':
            case '\x1b':
              break;
            default:
              if (iVar5 == -2) {
                iVar5 = 0;
              }
              break;
            case '\v':
            case '\f':
              pbVar22 = (byte *)((long)&a.len + (ulong)puVar20[(long)iVar8 + uVar11 + 1]);
              *pbVar22 = *pbVar22 | 1;
              break;
            case '\r':
              bVar3 = puVar20[(long)iVar8 + uVar11 + 2];
              for (uVar14 = (ulong)puVar20[(long)iVar8 + uVar11 + 1]; uVar14 < bVar3;
                  uVar14 = uVar14 + 1) {
                pbVar22 = (byte *)((long)&a.len + uVar14);
                *pbVar22 = *pbVar22 | 1;
              }
              break;
            case '\x13':
            case '\x14':
              pbVar22 = (byte *)((long)&a.len + (ulong)puVar20[(long)iVar8 + uVar11 + 1]);
              *pbVar22 = *pbVar22 | 2;
              bVar2 = true;
              break;
            case '\x16':
              sVar13 = 3;
            case '\x15':
              uVar6 = (uint)reopcode_info[puVar20[(long)iVar8 + uVar11]].size +
                      ((uint)*(ushort *)(puVar20 + (long)iVar8 + uVar11 + 1) << sVar13);
            case '\x01':
            case '\x02':
            case '\x03':
            case '\x04':
              if (iVar5 == -2) {
                iVar5 = 1;
              }
            }
          }
          if (bVar2) {
            lVar10 = 0;
            do {
              if (lVar10 == 0xff) goto LAB_0015fc43;
              pcVar21 = (char *)((long)&a.len + lVar10);
              lVar10 = lVar10 + 1;
            } while (*pcVar21 != '\x03');
            uVar11 = 0;
          }
          else {
LAB_0015fc43:
            uVar11 = (ulong)((iVar5 + 2U & 0xfffffffd) == 0);
          }
          uVar19 = 1;
          uVar6 = local_1d4;
          uVar7 = local_1ec;
        }
        iVar5 = (int)uVar11;
        if (uVar6 == 0) {
          local_1ec = uVar19;
          if ((int)local_1f8 != s->capture_count) {
            iVar8 = dbuf_insert(&s->byte_code,uVar4,3);
            if (iVar8 != 0) goto LAB_0016013b;
            (s->byte_code).buf[local_1e0] = '\r';
            (s->byte_code).buf[local_1e0 + 1] = (uint8_t)local_1f8;
            uVar15 = (ulong)(uVar4 + 3);
            (s->byte_code).buf[local_1e0 + 2] = (char)s->capture_count + 0xff;
          }
          uVar4 = (uint32_t)uVar15;
          uVar15 = uVar15 & 0xffffffff;
          if (uVar7 != 0x7fffffff) {
            if (uVar7 == 1) {
              iVar5 = dbuf_insert(&s->byte_code,uVar4,5);
              if (iVar5 != 0) goto LAB_0016013b;
              (s->byte_code).buf[uVar15] = (byte)local_1ec | 8;
              *(int *)((s->byte_code).buf + uVar15 + 1) = iVar24;
              paVar17 = local_200;
              pbVar22 = local_208;
            }
            else {
              if (uVar7 != 0) {
                local_1f8 = (long)(int)uVar4;
                iVar5 = dbuf_insert(&s->byte_code,uVar4,10);
                if (iVar5 != 0) goto LAB_0016013b;
                (s->byte_code).buf[uVar15] = '\x0f';
                puVar20 = (s->byte_code).buf;
                *(uint *)(puVar20 + local_1f8 + 1) = uVar7;
                puVar20[local_1f8 + 5] = (byte)local_1ec | 8;
                *(int *)((s->byte_code).buf + local_1f8 + 6) = iVar24 + 5;
                uVar4 = uVar4 + 5;
                goto LAB_0015feef;
              }
              (s->byte_code).size = uVar15;
              paVar17 = local_200;
              pbVar22 = local_208;
            }
            goto LAB_0015ff39;
          }
          local_1f8 = (long)(int)uVar4;
          iVar8 = dbuf_insert(&s->byte_code,uVar4,iVar5 + 5);
          if (iVar8 != 0) {
LAB_0016013b:
            re_parse_out_of_memory(s);
            return -1;
          }
          (s->byte_code).buf[uVar15] = (byte)local_1ec | 8;
          puVar20 = (s->byte_code).buf;
          *(int *)(puVar20 + uVar15 + 1) = iVar5 + iVar24 + 5;
          if (iVar5 == 0) {
            uVar19 = 7;
          }
          else {
            puVar20[local_1f8 + 5] = '\x19';
            uVar19 = 0x1a;
          }
        }
        else if (((uVar6 == 1) && (uVar7 == 0x7fffffff)) && (iVar5 == 0)) {
          uVar19 = uVar19 ^ 9;
        }
        else {
          if (uVar6 != 1) {
            local_1f8 = uVar11;
            local_1ec = uVar7;
            iVar5 = dbuf_insert(&s->byte_code,uVar4,5);
            if (iVar5 != 0) goto LAB_0016013b;
            (s->byte_code).buf[local_1e0] = '\x0f';
            *(uint *)((s->byte_code).buf + local_1e0 + 1) = uVar6;
            uVar4 = uVar4 + 5;
            re_emit_goto(s,0xe,uVar4);
            dbuf_putc(&s->byte_code,'\x10');
            uVar11 = local_1f8;
            uVar7 = local_1ec;
          }
          uVar15 = (ulong)uVar4;
          sVar12 = (size_t)iVar24;
          if (uVar7 != 0x7fffffff) {
            paVar17 = local_200;
            pbVar22 = local_208;
            if (uVar7 - uVar6 != 0 && (int)uVar6 <= (int)uVar7) {
              re_emit_op_u32(s,0xf,uVar7 - uVar6);
              local_1f8 = CONCAT44(local_1f8._4_4_,(int)(s->byte_code).size);
              re_emit_op_u32(s,uVar19 | 8,iVar24 + 5);
              dbuf_put_self(&s->byte_code,uVar15,sVar12);
              uVar4 = (uint32_t)local_1f8;
LAB_0015feef:
              re_emit_goto(s,0xe,uVar4);
              dbuf_putc(&s->byte_code,'\x10');
              paVar17 = local_200;
              pbVar22 = local_208;
            }
            goto LAB_0015ff39;
          }
          local_1f8 = CONCAT44(local_1f8._4_4_,(int)(s->byte_code).size);
          re_emit_op_u32(s,uVar19 | 8,(int)uVar11 + iVar24 + 5);
          if ((int)uVar11 == 0) {
            dbuf_put_self(&s->byte_code,uVar15,sVar12);
            uVar19 = 7;
          }
          else {
            dbuf_putc(&s->byte_code,'\x19');
            dbuf_put_self(&s->byte_code,uVar15,sVar12);
            uVar19 = 0x1a;
          }
          uVar4 = (uint32_t)local_1f8;
        }
        re_emit_goto(s,uVar19,uVar4);
        paVar17 = local_200;
        pbVar22 = local_208;
      }
    }
LAB_0015ff39:
    local_208 = pbVar22;
    s->buf_ptr = pbVar23;
    if ((int)local_1e8 != 0) {
      sVar12 = (s->byte_code).size;
      sVar16 = sVar12 - local_1d0;
      iVar5 = dbuf_realloc(&s->byte_code,sVar16 + sVar12);
      if (iVar5 != 0) {
        return -1;
      }
      puVar20 = (s->byte_code).buf + sVar1;
      memmove(puVar20 + sVar16,puVar20,sVar12 - sVar1);
      puVar20 = (s->byte_code).buf;
      memcpy(puVar20 + sVar1,puVar20 + sVar12,sVar16);
    }
  } while( true );
}

Assistant:

static int re_parse_alternative(REParseState *s, BOOL is_backward_dir)
{
    const uint8_t *p;
    int ret;
    size_t start, term_start, end, term_size;

    start = s->byte_code.size;
    for(;;) {
        p = s->buf_ptr;
        if (p >= s->buf_end)
            break;
        if (*p == '|' || *p == ')')
            break;
        term_start = s->byte_code.size;
        ret = re_parse_term(s, is_backward_dir);
        if (ret)
            return ret;
        if (is_backward_dir) {
            /* reverse the order of the terms (XXX: inefficient, but
               speed is not really critical here) */
            end = s->byte_code.size;
            term_size = end - term_start;
            if (dbuf_realloc(&s->byte_code, end + term_size))
                return -1;
            memmove(s->byte_code.buf + start + term_size,
                    s->byte_code.buf + start,
                    end - start);
            memcpy(s->byte_code.buf + start, s->byte_code.buf + end,
                   term_size);
        }
    }
    return 0;
}